

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTry
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Try *tryy_00;
  Try *tryy;
  IRBuilder *this_local;
  Signature sig_local;
  Name label_local;
  
  tryy_00 = MixedArena::alloc<wasm::Try>(&this->wasm->allocator);
  (tryy_00->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id =
       sig.results.id.id;
  visitTryStart(__return_storage_ptr__,this,tryy_00,label,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTry(Name label, Signature sig) {
  auto* tryy = wasm.allocator.alloc<Try>();
  tryy->type = sig.results;
  return visitTryStart(tryy, label, sig.params);
}